

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O0

void Gia_ManMarkAutonomous(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  undefined4 local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  Gia_ManCleanMark0(p);
  Gia_ManIncrementTravId(p);
  local_1c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar2 = false;
    if (local_1c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_18 = Gia_ManCi(p,iVar1 + local_1c);
      bVar2 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Gia_ManMarkAutonomous_rec(p,pGStack_18);
    local_1c = local_1c + 1;
  }
  Gia_ManIncrementTravId(p);
  local_1c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar2 = false;
    if (local_1c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_18 = Gia_ManCi(p,iVar1 + local_1c);
      bVar2 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    if ((*(ulong *)pGStack_18 >> 0x1e & 1) != 0) {
      Gia_ObjSetTravIdCurrent(p,pGStack_18);
    }
    local_1c = local_1c + 1;
  }
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Gia_ManMarkAutonomous( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanMark0( p );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManMarkAutonomous_rec( p, pObj );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachRo( p, pObj, i )
        if ( pObj->fMark0 )
            Gia_ObjSetTravIdCurrent( p, pObj );
    Gia_ManCleanMark0( p );
}